

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O0

void __thiscall
ExtPubkey_GetPubkeyAddress_Test::~ExtPubkey_GetPubkeyAddress_Test
          (ExtPubkey_GetPubkeyAddress_Test *this)

{
  ExtPubkey_GetPubkeyAddress_Test *this_local;
  
  ~ExtPubkey_GetPubkeyAddress_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtPubkey, GetPubkeyAddress) {
  std::string ext_base58 = "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua";

  ExtPubkey pubkey(ext_base58);
  auto addr1 = pubkey.GetPubkeyAddress();
  EXPECT_EQ("tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
    addr1.GetAddress());
  auto addrs1 = pubkey.GetPubkeyAddresses();
  EXPECT_EQ(4, addrs1.size());
  if (addrs1.size() == 4) {
    EXPECT_EQ("tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
      addrs1[0].GetAddress());
    EXPECT_EQ("tb1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfs5wcm3n",
      addrs1[1].GetAddress());
    EXPECT_EQ("2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
      addrs1[2].GetAddress());
    EXPECT_EQ("mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
      addrs1[3].GetAddress());
  }

  auto addr2 = pubkey.GetPubkeyAddress(
      AddressType::kWitnessUnknown, nullptr, NetType::kRegtest);
  EXPECT_EQ("bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",
    addr2.GetAddress());
  auto addrs2 = pubkey.GetPubkeyAddresses(nullptr, NetType::kRegtest);
  EXPECT_EQ(4, addrs1.size());
  if (addrs2.size() == 4) {
    EXPECT_EQ("bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",
      addrs2[0].GetAddress());
    EXPECT_EQ("bcrt1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsehjayf",
      addrs2[1].GetAddress());
    EXPECT_EQ("2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
      addrs2[2].GetAddress());
    EXPECT_EQ("mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
      addrs2[3].GetAddress());
  }

#ifndef CFD_DISABLE_ELEMENTS
  auto el_list = cfd::core::GetElementsAddressFormatList();
  auto addr3 = pubkey.GetPubkeyAddress(AddressType::kP2pkhAddress,
      &el_list, NetType::kElementsRegtest);
  EXPECT_EQ("2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",
    addr3.GetAddress());

  auto addrs3 = pubkey.GetPubkeyAddresses(
      &el_list, NetType::kElementsRegtest);
  EXPECT_EQ(4, addrs3.size());
  if (addrs3.size() == 4) {
    EXPECT_EQ("ert1qgrys9hdcsunfh5qklzj85e6qev9v5gms7zecq9",
      addrs3[0].GetAddress());
    EXPECT_EQ("ert1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsgy6rdd",
      addrs3[1].GetAddress());
    EXPECT_EQ("XTL5r53bjRBtL24WwjCMpGtaAnr5wmHkXL",
      addrs3[2].GetAddress());
    EXPECT_EQ("2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",
      addrs3[3].GetAddress());
  }
#endif  // CFD_DISABLE_ELEMENTS
}